

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_parser.cpp
# Opt level: O2

void __thiscall
ArgParser::add(ArgParser *this,uint *var,string *name,string *shortName,string *description,
              uint *validArgs,int nrValid,bool optional)

{
  pointer pAVar1;
  pointer pAVar2;
  int iVar3;
  allocator_type local_a9;
  string local_a8;
  string local_88;
  string local_68;
  vector<unsigned_int,std::allocator<unsigned_int>> local_48 [24];
  
  std::__cxx11::string::string((string *)&local_68,(string *)name);
  std::__cxx11::string::string((string *)&local_88,(string *)shortName);
  std::__cxx11::string::string((string *)&local_a8,(string *)description);
  add(this,var,&local_68,&local_88,&local_a8,optional);
  std::__cxx11::string::~string((string *)&local_a8);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::~string((string *)&local_68);
  pAVar1 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pAVar2 = (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
           super__Vector_impl_data._M_start;
  std::vector<unsigned_int,std::allocator<unsigned_int>>::vector<unsigned_int*,void>
            (local_48,validArgs,validArgs + nrValid,&local_a9);
  iVar3 = (int)(((long)pAVar1 - (long)pAVar2) / 0xe0) + -1;
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_move_assign
            (&(this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
              super__Vector_impl_data._M_start[iVar3].validUINT,local_48);
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            ((_Vector_base<unsigned_int,_std::allocator<unsigned_int>_> *)local_48);
  (this->m_args).super__Vector_base<ArgHolder,_std::allocator<ArgHolder>_>._M_impl.
  super__Vector_impl_data._M_start[iVar3].checkValid = true;
  return;
}

Assistant:

void ArgParser::add(unsigned int *var,
                    std::string name, std::string shortName, std::string description,
                    unsigned int validArgs[], int nrValid,
                    bool optional)
{
    add(var, name, shortName, description, optional);
    int ind = m_args.size() - 1;
    m_args[ind].validUINT = std::vector<unsigned int>(validArgs, validArgs+nrValid);
    m_args[ind].checkValid = true;
}